

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O2

bool Internal_WriteEdgePtrList
               (unsigned_short edge_count,unsigned_short edgeN_capacity,ON_SubDEdgePtr *edgeN,
               unsigned_short edgeX_capacity,ON_SubDEdgePtr *edgeX,ON_BinaryArchive *archive)

{
  bool bVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  uint archive_id;
  ushort uVar3;
  ON__UINT16 local_32;
  
  local_32 = edge_count;
  ON_SubDArchiveIdMap::ValidateArrayCounts
            (&local_32,CONCAT62(in_register_00000032,edgeN_capacity) & 0xffffffff,edgeN,
             edgeX_capacity,edgeX);
  bVar1 = ON_BinaryArchive::WriteShort(archive,local_32);
  if (bVar1) {
    if (local_32 == 0) {
      return true;
    }
    for (uVar3 = 0; uVar3 < local_32; uVar3 = uVar3 + 1) {
      if (edgeN_capacity == uVar3) {
        edgeN = edgeX;
      }
      uVar2 = edgeN->m_ptr & 0xfffffffffffffff8;
      if (uVar2 == 0) {
        archive_id = 0;
      }
      else {
        archive_id = *(uint *)(uVar2 + 0xc);
      }
      bVar1 = Internal_WriteArchiveIdAndFlags(archive_id,edgeN->m_ptr,archive);
      if (!bVar1) break;
      edgeN = edgeN + 1;
    }
    if (local_32 <= uVar3) {
      return true;
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool Internal_WriteEdgePtrList(
  unsigned short edge_count,
  unsigned short edgeN_capacity,
  const ON_SubDEdgePtr* edgeN,
  unsigned short edgeX_capacity,
  const ON_SubDEdgePtr* edgeX,
  ON_BinaryArchive& archive
  )
{
  for (;;)
  {
    ON_SubDArchiveIdMap::ValidateArrayCounts(edge_count,edgeN_capacity,edgeN,edgeX_capacity,edgeX);

    if (!archive.WriteShort(edge_count))
      break;

    if ( 0 == edge_count )
      return true;

    const ON_SubDEdgePtr* eptr = edgeN;
    unsigned short i = 0;
    for (i = 0; i < edge_count; i++, eptr++)
    {
      if ( i == edgeN_capacity)
        eptr = edgeX;
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
      if (!Internal_WriteArchiveIdAndFlags((nullptr != edge) ? edge->ArchiveId() : 0,eptr->m_ptr,archive))
        break;
    }
    if ( i < edge_count )
      break;

    return true;
  }
  return ON_SUBD_RETURN_ERROR(false);
}